

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  uint in_ECX;
  double *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float rhs;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  float in_XMM3_Da;
  double v_cur_norm_curved;
  double v_new_norm_curved;
  double v_old_norm_curved;
  double v_old_ref_for_accum_remainder;
  double v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_locked;
  bool is_power;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  double in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 in_stack_ffffffffffffff68;
  bool bVar7;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar8;
  byte bVar9;
  undefined8 in_stack_ffffffffffffff90;
  double dVar10;
  undefined8 in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffa8;
  float fVar11;
  undefined1 uVar12;
  byte bVar13;
  float local_14;
  bool local_1;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_ECX & 1) != 0);
  bVar9 = in_EDI == 8 || in_EDI == 9;
  bVar13 = in_XMM1_Qa < in_XMM2_Qa;
  bVar8 = false;
  if ((((in_XMM3_Da != 1.0) || (NAN(in_XMM3_Da))) && (bVar8 = false, in_EDI == 8 || in_EDI == 9)) &&
     (bVar8 = false, (bool)bVar13)) {
    bVar8 = in_XMM2_Qa - in_XMM1_Qa < 3.4028234663852886e+38;
  }
  uVar12 = in_XMM2_Qa < in_XMM1_Qa;
  if (in_XMM2_Qa < in_XMM1_Qa) {
    local_1 = false;
  }
  else {
    local_14 = in_XMM0_Da;
    if (((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) &&
       (((bool)bVar13 && (in_XMM2_Qa - in_XMM1_Qa < 3.4028234663852886e+38)))) {
      local_14 = (float)((in_XMM2_Qa - in_XMM1_Qa) * (double)GImGui->DragSpeedDefaultRatio);
    }
    fVar11 = 0.0;
    if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
        (bVar2 = IsMousePosValid((ImVec2 *)
                                 CONCAT17(bVar9,CONCAT16(bVar8,CONCAT24(in_stack_ffffffffffffff74,
                                                                        in_stack_ffffffffffffff70)))
                                ), !bVar2)) || ((pIVar1->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
        if ((bVar9 & 1) != 0) {
          ImParseFormatPrecision
                    ((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                      CONCAT13(in_stack_ffffffffffffff6b,
                                               CONCAT12(in_stack_ffffffffffffff6a,
                                                        CONCAT11(in_stack_ffffffffffffff69,
                                                                 in_stack_ffffffffffffff68)))),
                     CONCAT13(in_stack_ffffffffffffff67,
                              CONCAT12(in_stack_ffffffffffffff66,in_stack_ffffffffffffff64)));
        }
        in_stack_ffffffffffffffa8 =
             GetNavInputAmount2d((ImGuiNavDirSourceFlags)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                 (ImGuiInputReadMode)in_stack_ffffffffffffff98,
                                 (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                 (float)in_stack_ffffffffffffff90);
        pfVar4 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT17(in_stack_ffffffffffffff67,
                                             CONCAT16(in_stack_ffffffffffffff66,
                                                      CONCAT24(in_stack_ffffffffffffff64,
                                                               in_stack_ffffffffffffff60))),
                                    (size_t)in_stack_ffffffffffffff58);
        fVar11 = *pfVar4;
        rhs = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff60);
        local_14 = ImMax<float>(local_14,rhs);
      }
    }
    else {
      pfVar4 = ImVec2::operator[]((ImVec2 *)
                                  CONCAT17(in_stack_ffffffffffffff67,
                                           CONCAT16(in_stack_ffffffffffffff66,
                                                    CONCAT24(in_stack_ffffffffffffff64,
                                                             in_stack_ffffffffffffff60))),
                                  (size_t)in_stack_ffffffffffffff58);
      fVar11 = *pfVar4;
      if (((pIVar1->IO).KeyAlt & 1U) != 0) {
        fVar11 = fVar11 * 0.01;
      }
      if (((pIVar1->IO).KeyShift & 1U) != 0) {
        fVar11 = fVar11 * 10.0;
      }
    }
    local_14 = local_14 * fVar11;
    if (uVar3 == 1) {
      local_14 = -local_14;
    }
    bVar2 = false;
    if (((bVar13 & 1) != 0) && ((*in_RSI < in_XMM2_Qa || (bVar2 = true, local_14 <= 0.0)))) {
      bVar2 = *in_RSI <= in_XMM1_Qa && local_14 < 0.0;
    }
    bVar7 = false;
    if (((bVar8 & 1) != 0) &&
       (((0.0 <= local_14 ||
         (in_stack_ffffffffffffff67 = true, bVar7 = true, pIVar1->DragCurrentAccum <= 0.0)) &&
        (in_stack_ffffffffffffff66 = false, in_stack_ffffffffffffff67 = in_stack_ffffffffffffff66,
        bVar7 = (bool)in_stack_ffffffffffffff66, 0.0 < local_14)))) {
      in_stack_ffffffffffffff66 = pIVar1->DragCurrentAccum <= 0.0 && pIVar1->DragCurrentAccum != 0.0
      ;
      in_stack_ffffffffffffff67 = in_stack_ffffffffffffff66;
      bVar7 = (bool)in_stack_ffffffffffffff66;
    }
    if ((((pIVar1->ActiveIdIsJustActivated & 1U) != 0) || (bVar2)) || (bVar7 != false)) {
      pIVar1->DragCurrentAccum = 0.0;
      pIVar1->DragCurrentAccumDirty = false;
    }
    else if ((local_14 != 0.0) || (NAN(local_14))) {
      pIVar1->DragCurrentAccum = local_14 + pIVar1->DragCurrentAccum;
      pIVar1->DragCurrentAccumDirty = true;
    }
    if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
      local_1 = false;
    }
    else {
      dVar10 = 0.0;
      if ((bVar8 & 1) != 0) {
        dVar10 = ImPow((double)CONCAT17(in_stack_ffffffffffffff67,
                                        CONCAT16(in_stack_ffffffffffffff66,
                                                 CONCAT24(in_stack_ffffffffffffff64,
                                                          in_stack_ffffffffffffff60))),
                       in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff58 = in_XMM1_Qa;
        ImSaturate((float)(dVar10 + (double)pIVar1->DragCurrentAccum / (in_XMM2_Qa - in_XMM1_Qa)));
        ImPow(0.0,3.321241e-39);
      }
      dVar5 = RoundScalarWithFormatT<double,double>
                        ((char *)CONCAT44(uVar3,CONCAT13(bVar9,CONCAT12(bVar13,CONCAT11(bVar8,uVar12
                                                                                       )))),
                         (ImGuiDataType)local_14,(double)in_stack_ffffffffffffffa8);
      pIVar1->DragCurrentAccumDirty = false;
      if ((bVar8 & 1) == 0) {
        pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(dVar5 - *in_RSI);
      }
      else {
        dVar6 = ImPow((double)CONCAT17(in_stack_ffffffffffffff67,
                                       CONCAT16(in_stack_ffffffffffffff66,
                                                CONCAT24(in_stack_ffffffffffffff64,
                                                         in_stack_ffffffffffffff60))),
                      in_stack_ffffffffffffff58);
        pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(dVar6 - dVar10);
      }
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        dVar5 = 0.0;
      }
      if (((*in_RSI != dVar5) || (NAN(*in_RSI) || NAN(dVar5))) && ((bVar13 & 1) != 0)) {
        if ((dVar5 < in_XMM1_Qa) ||
           (((*in_RSI <= dVar5 && dVar5 != *in_RSI && (local_14 < 0.0)) && ((bVar9 & 1) == 0)))) {
          dVar5 = in_XMM1_Qa;
        }
        if ((in_XMM2_Qa < dVar5) || (((dVar5 < *in_RSI && (0.0 < local_14)) && ((bVar9 & 1) == 0))))
        {
          dVar5 = in_XMM2_Qa;
        }
      }
      if ((*in_RSI != dVar5) || (NAN(*in_RSI) || NAN(dVar5))) {
        *in_RSI = dVar5;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}